

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O1

void ImGui_ImplSDL2_PlatformSetImeData
               (ImGuiContext *param_1,ImGuiViewport *param_2,ImGuiPlatformImeData *data)

{
  if (data->WantVisible == true) {
    SDL_SetTextInputRect();
  }
  return;
}

Assistant:

static void ImGui_ImplSDL2_PlatformSetImeData(ImGuiContext*, ImGuiViewport*, ImGuiPlatformImeData* data)
{
    if (data->WantVisible)
    {
        SDL_Rect r;
        r.x = (int)data->InputPos.x;
        r.y = (int)data->InputPos.y;
        r.w = 1;
        r.h = (int)data->InputLineHeight;
        SDL_SetTextInputRect(&r);
    }
}